

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWritePla.c
# Opt level: O2

int Io_WriteMoPlaOneM(FILE *pFile,Abc_Ntk_t *pNtk,int nMints)

{
  DdManager *dd;
  Vec_Ptr_t *p;
  Abc_Obj_t *pAVar1;
  void *Entry;
  DdNode *pDVar2;
  DdNode *pDVar3;
  int iVar4;
  int i;
  char *__s;
  
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    if (pNtk->ntkType != ABC_NTK_LOGIC) {
      return 1;
    }
    if (pNtk->ntkFunc != ABC_FUNC_BDD) {
      return 1;
    }
    pAVar1 = Abc_NtkCo(pNtk,0);
    if (((DdManager *)pNtk->pManFunc)->size == pNtk->vCis->nSize) {
      Io_WriteMoPlaOneIntMintermsM
                (pFile,pNtk,(DdManager *)pNtk->pManFunc,
                 *(DdNode **)((long)pAVar1->pNtk->vObjs->pArray[*(pAVar1->vFanins).pArray] + 0x38),
                 nMints);
      return 1;
    }
    puts("Cannot write minterms because the size of the manager for local BDDs is not equal to");
    puts("the number of primary inputs. (It is likely that the current network is not collapsed.)");
    return 1;
  }
  dd = (DdManager *)Abc_NtkBuildGlobalBdds(pNtk,10000000,1,1,0,0);
  if (dd == (DdManager *)0x0) {
    return 0;
  }
  p = Vec_PtrAlloc(pNtk->vCos->nSize);
  for (iVar4 = 0; iVar4 < pNtk->vCos->nSize; iVar4 = iVar4 + 1) {
    pAVar1 = Abc_NtkCo(pNtk,iVar4);
    Entry = Abc_ObjGlobalBdd(pAVar1);
    Vec_PtrPush(p,Entry);
  }
  pDVar2 = (DdNode *)Vec_PtrEntry(p,0);
  pDVar3 = Cudd_ReadOne(dd);
  if (pDVar2 == pDVar3) {
    __s = "First primary output has constant 1 function.";
  }
  else {
    pDVar3 = Cudd_ReadOne(dd);
    if (pDVar3 != (DdNode *)((ulong)pDVar2 ^ 1)) {
      Io_WriteMoPlaOneIntMintermsM(pFile,pNtk,dd,pDVar2,nMints);
      goto LAB_002ee15a;
    }
    __s = "First primary output has constant 0 function.";
  }
  puts(__s);
LAB_002ee15a:
  Abc_NtkFreeGlobalBdds(pNtk,0);
  iVar4 = p->nSize;
  for (i = 0; i < iVar4; i = i + 1) {
    pDVar2 = (DdNode *)Vec_PtrEntry(p,i);
    Cudd_RecursiveDeref(dd,pDVar2);
  }
  Vec_PtrFree(p);
  Cudd_Quit(dd);
  return 1;
}

Assistant:

int Io_WriteMoPlaOneM( FILE * pFile, Abc_Ntk_t * pNtk, int nMints )
{
    int fVerbose = 0;
    DdManager * dd;
    DdNode * bFunc;
    Vec_Ptr_t * vFuncsGlob;
    Abc_Obj_t * pObj;
    int i;
    if ( Abc_NtkIsStrash(pNtk) )
    {
        assert( Abc_NtkIsStrash(pNtk) );
        dd = (DdManager *)Abc_NtkBuildGlobalBdds( pNtk, 10000000, 1, 1, 0, fVerbose );
        if ( dd == NULL )
            return 0;
        if ( fVerbose )
            printf( "Shared BDD size = %6d nodes.\n", Cudd_ReadKeys(dd) - Cudd_ReadDead(dd) );

        // complement the global functions
        vFuncsGlob = Vec_PtrAlloc( Abc_NtkCoNum(pNtk) );
        Abc_NtkForEachCo( pNtk, pObj, i )
            Vec_PtrPush( vFuncsGlob, Abc_ObjGlobalBdd(pObj) );

        // get the output function
        bFunc = (DdNode *)Vec_PtrEntry(vFuncsGlob, 0);
        if ( bFunc == Cudd_ReadOne(dd) )
            printf( "First primary output has constant 1 function.\n" );
        else if ( Cudd_Not(bFunc) == Cudd_ReadOne(dd) )
            printf( "First primary output has constant 0 function.\n" );
        else
            Io_WriteMoPlaOneIntMintermsM( pFile, pNtk, dd, bFunc, nMints );
        Abc_NtkFreeGlobalBdds( pNtk, 0 );

        // cleanup
        Vec_PtrForEachEntry( DdNode *, vFuncsGlob, bFunc, i )
            Cudd_RecursiveDeref( dd, bFunc );
        Vec_PtrFree( vFuncsGlob );
        //Extra_StopManager( dd );
        Cudd_Quit( dd );
    }
    else if ( Abc_NtkIsBddLogic(pNtk) )
    {
        DdNode * bFunc = (DdNode *)Abc_ObjFanin0(Abc_NtkCo(pNtk, 0))->pData;
        dd = (DdManager *)pNtk->pManFunc;
        if ( dd->size == Abc_NtkCiNum(pNtk) )
            Io_WriteMoPlaOneIntMintermsM( pFile, pNtk, dd, bFunc, nMints );
        else
        {
            printf( "Cannot write minterms because the size of the manager for local BDDs is not equal to\n" );
            printf( "the number of primary inputs. (It is likely that the current network is not collapsed.)\n" );
        }
    }
    return 1;
}